

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O0

void __thiscall eglu::BadAllocError::BadAllocError(BadAllocError *this,char *errStr)

{
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *errStr_local;
  BadAllocError *this_local;
  
  local_18 = errStr;
  errStr_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,errStr,&local_39);
  tcu::ResourceError::ResourceError(&this->super_ResourceError,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__BadAllocError_004031d0;
  return;
}

Assistant:

BadAllocError::BadAllocError (const char* errStr)
	: tcu::ResourceError(errStr)
{
}